

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O0

int __thiscall LengauerTarjan::EVAL(LengauerTarjan *this,int v)

{
  reference pvVar1;
  int in_ESI;
  long in_RDI;
  int in_stack_0000002c;
  LengauerTarjan *in_stack_00000030;
  undefined4 local_4;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
  local_4 = in_ESI;
  if (*pvVar1 != -1) {
    COMPRESS(in_stack_00000030,in_stack_0000002c);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)in_ESI);
    local_4 = *pvVar1;
  }
  return local_4;
}

Assistant:

int LengauerTarjan::EVAL(int v) {
	if (ancestor[v] == -1) {
		return v;
	}
	COMPRESS(v);
	return label[v];
}